

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFindPackageCommand::FindAppBundleConfig(cmFindPackageCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  string *p;
  pointer prefix_in;
  
  prefix_in = (this->super_cmFindCommon).SearchPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindCommon).SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prefix_in == pbVar1) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = SearchAppBundlePrefix(this,prefix_in);
      if (bVar2) {
        return bVar2;
      }
      prefix_in = prefix_in + 1;
    } while (prefix_in != pbVar1);
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::FindAppBundleConfig()
{
  std::vector<std::string> const& prefixes = this->SearchPaths;
  for (std::string const& p : prefixes) {
    if (this->SearchAppBundlePrefix(p)) {
      return true;
    }
  }
  return false;
}